

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveLright3(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *vec,int *ridx,int *rn,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eps,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *vec2,int *ridx2,int *rn2,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eps2,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *vec3,int *ridx3,int *rn3,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eps3)

{
  ulong uVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  bool bVar7;
  ulong uVar8;
  cpp_dec_float<50U,_int,_void> *pcVar9;
  int *piVar10;
  int *piVar11;
  int iVar12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  tmp1;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  tmp3;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  tmp2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_ac8;
  int *local_a88;
  int *local_a80;
  cpp_dec_float<50U,_int,_void> local_a78;
  int *local_a40;
  pointer local_a38;
  ulong local_a30;
  int *local_a28;
  ulong local_a20;
  cpp_dec_float<50U,_int,_void> local_a18;
  int *local_9d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_9d0;
  cpp_dec_float<50U,_int,_void> local_9c8;
  cpp_dec_float<50U,_int,_void> local_990;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_958;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_918;
  cpp_dec_float<50U,_int,_void> local_8d8;
  cpp_dec_float<50U,_int,_void> local_8a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_868;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_828;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_768;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_728;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_668;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_628;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_568;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_528;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_468;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_428;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_368;
  cpp_dec_float<50U,_int,_void> local_328;
  cpp_dec_float<50U,_int,_void> local_2e8;
  cpp_dec_float<50U,_int,_void> local_2a8;
  cpp_dec_float<50U,_int,_void> local_268;
  cpp_dec_float<50U,_int,_void> local_228;
  cpp_dec_float<50U,_int,_void> local_1e8;
  cpp_dec_float<50U,_int,_void> local_1a8;
  cpp_dec_float<50U,_int,_void> local_168;
  cpp_dec_float<50U,_int,_void> local_128;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_a18.fpclass = cpp_dec_float_finite;
  local_a18.prec_elem = 10;
  local_a18.data._M_elems[0] = 0;
  local_a18.data._M_elems[1] = 0;
  local_a18.data._M_elems[2] = 0;
  local_a18.data._M_elems[3] = 0;
  local_a18.data._M_elems[4] = 0;
  local_a18.data._M_elems[5] = 0;
  local_a18.data._M_elems._24_5_ = 0;
  local_a18.data._M_elems[7]._1_3_ = 0;
  local_a18.data._M_elems._32_5_ = 0;
  local_a18.data._M_elems[9]._1_3_ = 0;
  local_a18.exp = 0;
  local_a18.neg = false;
  local_a78.fpclass = cpp_dec_float_finite;
  local_a78.prec_elem = 10;
  local_a78.data._M_elems[0] = 0;
  local_a78.data._M_elems[1] = 0;
  local_a78.data._M_elems[2] = 0;
  local_a78.data._M_elems[3] = 0;
  local_a78.data._M_elems[4] = 0;
  local_a78.data._M_elems[5] = 0;
  local_a78.data._M_elems._24_5_ = 0;
  local_a78.data._M_elems[7]._1_3_ = 0;
  local_a78.data._M_elems._32_5_ = 0;
  local_a78.data._M_elems[9]._1_3_ = 0;
  local_a78.exp = 0;
  local_a78.neg = false;
  local_ac8.fpclass = cpp_dec_float_finite;
  local_ac8.prec_elem = 10;
  local_ac8.data._M_elems[0] = 0;
  local_ac8.data._M_elems[1] = 0;
  local_ac8.data._M_elems[2] = 0;
  local_ac8.data._M_elems[3] = 0;
  local_ac8.data._M_elems[4] = 0;
  local_ac8.data._M_elems[5] = 0;
  local_ac8.data._M_elems._24_5_ = 0;
  local_ac8.data._M_elems[7]._1_3_ = 0;
  local_ac8.data._M_elems._32_5_ = 0;
  local_ac8.data._M_elems[9]._1_3_ = 0;
  local_ac8.exp = 0;
  local_ac8.neg = false;
  uVar3 = (this->l).firstUpdate;
  uVar8 = 0;
  local_a20 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    local_a20 = uVar8;
  }
  local_a38 = (this->l).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_a40 = (this->l).idx;
  local_9d8 = (this->l).row;
  local_a28 = (this->l).start;
  local_a88 = ridx;
  local_a80 = rn;
  local_9d0 = eps;
  while (piVar11 = local_a28, uVar8 != local_a20) {
    iVar4 = local_9d8[uVar8];
    uVar6 = *(undefined8 *)(vec[iVar4].m_backend.data._M_elems + 8);
    local_a18.data._M_elems._32_5_ = SUB85(uVar6,0);
    local_a18.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_a18.data._M_elems._0_8_ = *(undefined8 *)vec[iVar4].m_backend.data._M_elems;
    local_a18.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar4].m_backend.data._M_elems + 2);
    puVar2 = vec[iVar4].m_backend.data._M_elems + 4;
    local_a18.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    uVar6 = *(undefined8 *)(puVar2 + 2);
    local_a18.data._M_elems._24_5_ = SUB85(uVar6,0);
    local_a18.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_a18.exp = vec[iVar4].m_backend.exp;
    local_a18.neg = vec[iVar4].m_backend.neg;
    local_918.m_backend.fpclass = vec[iVar4].m_backend.fpclass;
    local_918.m_backend.prec_elem = vec[iVar4].m_backend.prec_elem;
    local_a18.prec_elem = local_918.m_backend.prec_elem;
    local_a18.fpclass = local_918.m_backend.fpclass;
    local_a78.data._M_elems._0_8_ = *(undefined8 *)vec2[iVar4].m_backend.data._M_elems;
    local_a78.data._M_elems._8_8_ = *(undefined8 *)(vec2[iVar4].m_backend.data._M_elems + 2);
    puVar2 = vec2[iVar4].m_backend.data._M_elems + 4;
    local_a78.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    uVar6 = *(undefined8 *)(puVar2 + 2);
    local_a78.data._M_elems._24_5_ = SUB85(uVar6,0);
    local_a78.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    uVar6 = *(undefined8 *)(vec2[iVar4].m_backend.data._M_elems + 8);
    local_a78.data._M_elems._32_5_ = SUB85(uVar6,0);
    local_a78.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_a78.exp = vec2[iVar4].m_backend.exp;
    local_a78.neg = vec2[iVar4].m_backend.neg;
    local_a78.fpclass = vec2[iVar4].m_backend.fpclass;
    local_a78.prec_elem = vec2[iVar4].m_backend.prec_elem;
    local_ac8.data._M_elems._0_8_ = *(undefined8 *)vec3[iVar4].m_backend.data._M_elems;
    local_ac8.data._M_elems._8_8_ = *(undefined8 *)(vec3[iVar4].m_backend.data._M_elems + 2);
    puVar2 = vec3[iVar4].m_backend.data._M_elems + 4;
    local_ac8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    uVar6 = *(undefined8 *)(puVar2 + 2);
    local_ac8.data._M_elems._24_5_ = SUB85(uVar6,0);
    local_ac8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    uVar6 = *(undefined8 *)(vec3[iVar4].m_backend.data._M_elems + 8);
    local_ac8.data._M_elems._32_5_ = SUB85(uVar6,0);
    local_ac8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_ac8.exp = vec3[iVar4].m_backend.exp;
    local_ac8.neg = vec3[iVar4].m_backend.neg;
    local_ac8.fpclass = vec3[iVar4].m_backend.fpclass;
    local_ac8.prec_elem = vec3[iVar4].m_backend.prec_elem;
    local_918.m_backend.data._M_elems._0_8_ = *(undefined8 *)vec[iVar4].m_backend.data._M_elems;
    local_918.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(vec[iVar4].m_backend.data._M_elems + 2);
    puVar2 = vec[iVar4].m_backend.data._M_elems + 4;
    local_918.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    local_918.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
    local_918.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(vec[iVar4].m_backend.data._M_elems + 8);
    local_368.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_9d0->m_backend).data._M_elems;
    local_368.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((local_9d0->m_backend).data._M_elems + 2);
    local_368.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((local_9d0->m_backend).data._M_elems + 4);
    local_368.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((local_9d0->m_backend).data._M_elems + 6);
    local_368.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((local_9d0->m_backend).data._M_elems + 8);
    local_368.m_backend.exp = (local_9d0->m_backend).exp;
    local_368.m_backend.neg = (local_9d0->m_backend).neg;
    local_368.m_backend.fpclass = (local_9d0->m_backend).fpclass;
    local_368.m_backend.prec_elem = (local_9d0->m_backend).prec_elem;
    local_918.m_backend.exp = local_a18.exp;
    local_918.m_backend.neg = local_a18.neg;
    bVar7 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_918,&local_368);
    local_a30 = uVar8;
    if (bVar7) {
      iVar4 = piVar11[uVar8];
      piVar10 = local_a40 + iVar4;
      pcVar9 = &local_a38[iVar4].m_backend;
      local_3a8.m_backend.data._M_elems[9]._1_3_ = local_a78.data._M_elems[9]._1_3_;
      local_3a8.m_backend.data._M_elems._32_5_ = local_a78.data._M_elems._32_5_;
      local_3a8.m_backend.data._M_elems[7]._1_3_ = local_a78.data._M_elems[7]._1_3_;
      local_3a8.m_backend.data._M_elems._24_5_ = local_a78.data._M_elems._24_5_;
      local_3a8.m_backend.data._M_elems[4] = local_a78.data._M_elems[4];
      local_3a8.m_backend.data._M_elems[5] = local_a78.data._M_elems[5];
      local_3a8.m_backend.data._M_elems[0] = local_a78.data._M_elems[0];
      local_3a8.m_backend.data._M_elems[1] = local_a78.data._M_elems[1];
      local_3a8.m_backend.data._M_elems[2] = local_a78.data._M_elems[2];
      local_3a8.m_backend.data._M_elems[3] = local_a78.data._M_elems[3];
      local_3a8.m_backend.exp = local_a78.exp;
      local_3a8.m_backend.neg = local_a78.neg;
      local_3a8.m_backend.fpclass = local_a78.fpclass;
      local_3a8.m_backend.prec_elem = local_a78.prec_elem;
      local_3e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
      local_3e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2)
      ;
      local_3e8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
      local_3e8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
      local_3e8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
      local_3e8.m_backend.exp = (eps2->m_backend).exp;
      local_3e8.m_backend.neg = (eps2->m_backend).neg;
      local_3e8.m_backend.fpclass = (eps2->m_backend).fpclass;
      local_3e8.m_backend.prec_elem = (eps2->m_backend).prec_elem;
      bVar7 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_3a8,&local_3e8);
      if (bVar7) {
        local_428.m_backend.data._M_elems[9]._1_3_ = local_ac8.data._M_elems[9]._1_3_;
        local_428.m_backend.data._M_elems._32_5_ = local_ac8.data._M_elems._32_5_;
        local_428.m_backend.data._M_elems[7]._1_3_ = local_ac8.data._M_elems[7]._1_3_;
        local_428.m_backend.data._M_elems._24_5_ = local_ac8.data._M_elems._24_5_;
        local_428.m_backend.data._M_elems[4] = local_ac8.data._M_elems[4];
        local_428.m_backend.data._M_elems[5] = local_ac8.data._M_elems[5];
        local_428.m_backend.data._M_elems[0] = local_ac8.data._M_elems[0];
        local_428.m_backend.data._M_elems[1] = local_ac8.data._M_elems[1];
        local_428.m_backend.data._M_elems[2] = local_ac8.data._M_elems[2];
        local_428.m_backend.data._M_elems[3] = local_ac8.data._M_elems[3];
        local_428.m_backend.exp = local_ac8.exp;
        local_428.m_backend.neg = local_ac8.neg;
        local_428.m_backend.fpclass = local_ac8.fpclass;
        local_428.m_backend.prec_elem = local_ac8.prec_elem;
        local_468.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps3->m_backend).data._M_elems;
        local_468.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 2);
        local_468.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 4);
        local_468.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 6);
        local_468.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 8);
        local_468.m_backend.exp = (eps3->m_backend).exp;
        local_468.m_backend.neg = (eps3->m_backend).neg;
        local_468.m_backend.fpclass = (eps3->m_backend).fpclass;
        local_468.m_backend.prec_elem = (eps3->m_backend).prec_elem;
        bVar7 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_428,&local_468);
        iVar12 = piVar11[uVar8 + 1];
        if (bVar7) {
          for (; iVar4 < iVar12; iVar12 = iVar12 + -1) {
            iVar5 = *piVar10;
            piVar10 = piVar10 + 1;
            local_68.fpclass = cpp_dec_float_finite;
            local_68.prec_elem = 10;
            local_68.data._M_elems[0] = 0;
            local_68.data._M_elems[1] = 0;
            local_68.data._M_elems[2] = 0;
            local_68.data._M_elems[3] = 0;
            local_68.data._M_elems[4] = 0;
            local_68.data._M_elems[5] = 0;
            local_68.data._M_elems._24_5_ = 0;
            local_68.data._M_elems[7]._1_3_ = 0;
            local_68.data._M_elems._32_5_ = 0;
            local_68._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_68,&local_a18,pcVar9);
            updateSolutionVectorLright
                      (this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_68,iVar5,vec + iVar5,local_a88,local_a80);
            local_a8.fpclass = cpp_dec_float_finite;
            local_a8.prec_elem = 10;
            local_a8.data._M_elems[0] = 0;
            local_a8.data._M_elems[1] = 0;
            local_a8.data._M_elems[2] = 0;
            local_a8.data._M_elems[3] = 0;
            local_a8.data._M_elems[4] = 0;
            local_a8.data._M_elems[5] = 0;
            local_a8.data._M_elems._24_5_ = 0;
            local_a8.data._M_elems[7]._1_3_ = 0;
            local_a8.data._M_elems._32_5_ = 0;
            local_a8._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_a8,&local_a78,pcVar9);
            updateSolutionVectorLright
                      (this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_a8,iVar5,vec2 + iVar5,ridx2,rn2);
            local_e8.fpclass = cpp_dec_float_finite;
            local_e8.prec_elem = 10;
            local_e8.data._M_elems[0] = 0;
            local_e8.data._M_elems[1] = 0;
            local_e8.data._M_elems[2] = 0;
            local_e8.data._M_elems[3] = 0;
            local_e8.data._M_elems[4] = 0;
            local_e8.data._M_elems[5] = 0;
            local_e8.data._M_elems._24_5_ = 0;
            local_e8.data._M_elems[7]._1_3_ = 0;
            local_e8.data._M_elems._32_5_ = 0;
            local_e8._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_e8,&local_ac8,pcVar9);
            updateSolutionVectorLright
                      (this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_e8,iVar5,vec3 + iVar5,ridx3,rn3);
            pcVar9 = pcVar9 + 1;
          }
        }
        else {
          for (; iVar4 < iVar12; iVar12 = iVar12 + -1) {
            iVar5 = *piVar10;
            piVar10 = piVar10 + 1;
            local_128.fpclass = cpp_dec_float_finite;
            local_128.prec_elem = 10;
            local_128.data._M_elems[0] = 0;
            local_128.data._M_elems[1] = 0;
            local_128.data._M_elems[2] = 0;
            local_128.data._M_elems[3] = 0;
            local_128.data._M_elems[4] = 0;
            local_128.data._M_elems[5] = 0;
            local_128.data._M_elems._24_5_ = 0;
            local_128.data._M_elems[7]._1_3_ = 0;
            local_128.data._M_elems._32_5_ = 0;
            local_128._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_128,&local_a18,pcVar9);
            updateSolutionVectorLright
                      (this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_128,iVar5,vec + iVar5,local_a88,local_a80);
            local_168.fpclass = cpp_dec_float_finite;
            local_168.prec_elem = 10;
            local_168.data._M_elems[0] = 0;
            local_168.data._M_elems[1] = 0;
            local_168.data._M_elems[2] = 0;
            local_168.data._M_elems[3] = 0;
            local_168.data._M_elems[4] = 0;
            local_168.data._M_elems[5] = 0;
            local_168.data._M_elems._24_5_ = 0;
            local_168.data._M_elems[7]._1_3_ = 0;
            local_168.data._M_elems._32_5_ = 0;
            local_168._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_168,&local_a78,pcVar9);
            updateSolutionVectorLright
                      (this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_168,iVar5,vec2 + iVar5,ridx2,rn2);
            pcVar9 = pcVar9 + 1;
          }
        }
      }
      else {
        local_4a8.m_backend.data._M_elems[9]._1_3_ = local_ac8.data._M_elems[9]._1_3_;
        local_4a8.m_backend.data._M_elems._32_5_ = local_ac8.data._M_elems._32_5_;
        local_4a8.m_backend.data._M_elems[7]._1_3_ = local_ac8.data._M_elems[7]._1_3_;
        local_4a8.m_backend.data._M_elems._24_5_ = local_ac8.data._M_elems._24_5_;
        local_4a8.m_backend.data._M_elems[4] = local_ac8.data._M_elems[4];
        local_4a8.m_backend.data._M_elems[5] = local_ac8.data._M_elems[5];
        local_4a8.m_backend.data._M_elems[0] = local_ac8.data._M_elems[0];
        local_4a8.m_backend.data._M_elems[1] = local_ac8.data._M_elems[1];
        local_4a8.m_backend.data._M_elems[2] = local_ac8.data._M_elems[2];
        local_4a8.m_backend.data._M_elems[3] = local_ac8.data._M_elems[3];
        local_4a8.m_backend.exp = local_ac8.exp;
        local_4a8.m_backend.neg = local_ac8.neg;
        local_4a8.m_backend.fpclass = local_ac8.fpclass;
        local_4a8.m_backend.prec_elem = local_ac8.prec_elem;
        local_4e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps3->m_backend).data._M_elems;
        local_4e8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 2);
        local_4e8.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 4);
        local_4e8.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 6);
        local_4e8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 8);
        local_4e8.m_backend.exp = (eps3->m_backend).exp;
        local_4e8.m_backend.neg = (eps3->m_backend).neg;
        local_4e8.m_backend.fpclass = (eps3->m_backend).fpclass;
        local_4e8.m_backend.prec_elem = (eps3->m_backend).prec_elem;
        bVar7 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_4a8,&local_4e8);
        iVar12 = piVar11[uVar8 + 1];
        if (bVar7) {
          for (; iVar4 < iVar12; iVar12 = iVar12 + -1) {
            iVar5 = *piVar10;
            piVar10 = piVar10 + 1;
            local_1a8.fpclass = cpp_dec_float_finite;
            local_1a8.prec_elem = 10;
            local_1a8.data._M_elems[0] = 0;
            local_1a8.data._M_elems[1] = 0;
            local_1a8.data._M_elems[2] = 0;
            local_1a8.data._M_elems[3] = 0;
            local_1a8.data._M_elems[4] = 0;
            local_1a8.data._M_elems[5] = 0;
            local_1a8.data._M_elems._24_5_ = 0;
            local_1a8.data._M_elems[7]._1_3_ = 0;
            local_1a8.data._M_elems._32_5_ = 0;
            local_1a8._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_1a8,&local_a18,pcVar9);
            updateSolutionVectorLright
                      (this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_1a8,iVar5,vec + iVar5,local_a88,local_a80);
            local_1e8.fpclass = cpp_dec_float_finite;
            local_1e8.prec_elem = 10;
            local_1e8.data._M_elems[0] = 0;
            local_1e8.data._M_elems[1] = 0;
            local_1e8.data._M_elems[2] = 0;
            local_1e8.data._M_elems[3] = 0;
            local_1e8.data._M_elems[4] = 0;
            local_1e8.data._M_elems[5] = 0;
            local_1e8.data._M_elems._24_5_ = 0;
            local_1e8.data._M_elems[7]._1_3_ = 0;
            local_1e8.data._M_elems._32_5_ = 0;
            local_1e8._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_1e8,&local_ac8,pcVar9);
            updateSolutionVectorLright
                      (this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_1e8,iVar5,vec3 + iVar5,ridx3,rn3);
            pcVar9 = pcVar9 + 1;
          }
        }
        else {
          for (; iVar4 < iVar12; iVar12 = iVar12 + -1) {
            iVar5 = *piVar10;
            piVar10 = piVar10 + 1;
            local_228.fpclass = cpp_dec_float_finite;
            local_228.prec_elem = 10;
            local_228.data._M_elems[0] = 0;
            local_228.data._M_elems[1] = 0;
            local_228.data._M_elems[2] = 0;
            local_228.data._M_elems[3] = 0;
            local_228.data._M_elems[4] = 0;
            local_228.data._M_elems[5] = 0;
            local_228.data._M_elems._24_5_ = 0;
            local_228.data._M_elems[7]._1_3_ = 0;
            local_228.data._M_elems._32_5_ = 0;
            local_228._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_228,&local_a18,pcVar9);
            updateSolutionVectorLright
                      (this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_228,iVar5,vec + iVar5,local_a88,local_a80);
            pcVar9 = pcVar9 + 1;
          }
        }
      }
    }
    else {
      local_528.m_backend.data._M_elems[9]._1_3_ = local_a78.data._M_elems[9]._1_3_;
      local_528.m_backend.data._M_elems._32_5_ = local_a78.data._M_elems._32_5_;
      local_528.m_backend.data._M_elems[7]._1_3_ = local_a78.data._M_elems[7]._1_3_;
      local_528.m_backend.data._M_elems._24_5_ = local_a78.data._M_elems._24_5_;
      local_528.m_backend.data._M_elems[4] = local_a78.data._M_elems[4];
      local_528.m_backend.data._M_elems[5] = local_a78.data._M_elems[5];
      local_528.m_backend.data._M_elems[0] = local_a78.data._M_elems[0];
      local_528.m_backend.data._M_elems[1] = local_a78.data._M_elems[1];
      local_528.m_backend.data._M_elems[2] = local_a78.data._M_elems[2];
      local_528.m_backend.data._M_elems[3] = local_a78.data._M_elems[3];
      local_528.m_backend.exp = local_a78.exp;
      local_528.m_backend.neg = local_a78.neg;
      local_528.m_backend.fpclass = local_a78.fpclass;
      local_528.m_backend.prec_elem = local_a78.prec_elem;
      local_568.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
      local_568.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2)
      ;
      local_568.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
      local_568.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
      local_568.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
      local_568.m_backend.exp = (eps2->m_backend).exp;
      local_568.m_backend.neg = (eps2->m_backend).neg;
      local_568.m_backend.fpclass = (eps2->m_backend).fpclass;
      local_568.m_backend.prec_elem = (eps2->m_backend).prec_elem;
      bVar7 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_528,&local_568);
      if (bVar7) {
        iVar4 = piVar11[uVar8];
        piVar10 = local_a40 + iVar4;
        pcVar9 = &local_a38[iVar4].m_backend;
        local_5a8.m_backend.data._M_elems[9]._1_3_ = local_ac8.data._M_elems[9]._1_3_;
        local_5a8.m_backend.data._M_elems._32_5_ = local_ac8.data._M_elems._32_5_;
        local_5a8.m_backend.data._M_elems[7]._1_3_ = local_ac8.data._M_elems[7]._1_3_;
        local_5a8.m_backend.data._M_elems._24_5_ = local_ac8.data._M_elems._24_5_;
        local_5a8.m_backend.data._M_elems[4] = local_ac8.data._M_elems[4];
        local_5a8.m_backend.data._M_elems[5] = local_ac8.data._M_elems[5];
        local_5a8.m_backend.data._M_elems[0] = local_ac8.data._M_elems[0];
        local_5a8.m_backend.data._M_elems[1] = local_ac8.data._M_elems[1];
        local_5a8.m_backend.data._M_elems[2] = local_ac8.data._M_elems[2];
        local_5a8.m_backend.data._M_elems[3] = local_ac8.data._M_elems[3];
        local_5a8.m_backend.exp = local_ac8.exp;
        local_5a8.m_backend.neg = local_ac8.neg;
        local_5a8.m_backend.fpclass = local_ac8.fpclass;
        local_5a8.m_backend.prec_elem = local_ac8.prec_elem;
        local_5e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps3->m_backend).data._M_elems;
        local_5e8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 2);
        local_5e8.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 4);
        local_5e8.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 6);
        local_5e8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 8);
        local_5e8.m_backend.exp = (eps3->m_backend).exp;
        local_5e8.m_backend.neg = (eps3->m_backend).neg;
        local_5e8.m_backend.fpclass = (eps3->m_backend).fpclass;
        local_5e8.m_backend.prec_elem = (eps3->m_backend).prec_elem;
        bVar7 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_5a8,&local_5e8);
        iVar12 = piVar11[uVar8 + 1];
        if (bVar7) {
          for (; iVar4 < iVar12; iVar12 = iVar12 + -1) {
            iVar5 = *piVar10;
            piVar10 = piVar10 + 1;
            local_268.fpclass = cpp_dec_float_finite;
            local_268.prec_elem = 10;
            local_268.data._M_elems[0] = 0;
            local_268.data._M_elems[1] = 0;
            local_268.data._M_elems[2] = 0;
            local_268.data._M_elems[3] = 0;
            local_268.data._M_elems[4] = 0;
            local_268.data._M_elems[5] = 0;
            local_268.data._M_elems._24_5_ = 0;
            local_268.data._M_elems[7]._1_3_ = 0;
            local_268.data._M_elems._32_5_ = 0;
            local_268._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_268,&local_a78,pcVar9);
            updateSolutionVectorLright
                      (this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_268,iVar5,vec2 + iVar5,ridx2,rn2);
            local_2a8.fpclass = cpp_dec_float_finite;
            local_2a8.prec_elem = 10;
            local_2a8.data._M_elems[0] = 0;
            local_2a8.data._M_elems[1] = 0;
            local_2a8.data._M_elems[2] = 0;
            local_2a8.data._M_elems[3] = 0;
            local_2a8.data._M_elems[4] = 0;
            local_2a8.data._M_elems[5] = 0;
            local_2a8.data._M_elems._24_5_ = 0;
            local_2a8.data._M_elems[7]._1_3_ = 0;
            local_2a8.data._M_elems._32_5_ = 0;
            local_2a8._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_2a8,&local_ac8,pcVar9);
            updateSolutionVectorLright
                      (this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_2a8,iVar5,vec3 + iVar5,ridx3,rn3);
            pcVar9 = pcVar9 + 1;
          }
        }
        else {
          for (; iVar4 < iVar12; iVar12 = iVar12 + -1) {
            iVar5 = *piVar10;
            piVar10 = piVar10 + 1;
            local_2e8.fpclass = cpp_dec_float_finite;
            local_2e8.prec_elem = 10;
            local_2e8.data._M_elems[0] = 0;
            local_2e8.data._M_elems[1] = 0;
            local_2e8.data._M_elems[2] = 0;
            local_2e8.data._M_elems[3] = 0;
            local_2e8.data._M_elems[4] = 0;
            local_2e8.data._M_elems[5] = 0;
            local_2e8.data._M_elems._24_5_ = 0;
            local_2e8.data._M_elems[7]._1_3_ = 0;
            local_2e8.data._M_elems._32_5_ = 0;
            local_2e8._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_2e8,&local_a78,pcVar9);
            updateSolutionVectorLright
                      (this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_2e8,iVar5,vec2 + iVar5,ridx2,rn2);
            pcVar9 = pcVar9 + 1;
          }
        }
      }
      else {
        local_628.m_backend.data._M_elems[9]._1_3_ = local_ac8.data._M_elems[9]._1_3_;
        local_628.m_backend.data._M_elems._32_5_ = local_ac8.data._M_elems._32_5_;
        local_628.m_backend.data._M_elems[7]._1_3_ = local_ac8.data._M_elems[7]._1_3_;
        local_628.m_backend.data._M_elems._24_5_ = local_ac8.data._M_elems._24_5_;
        local_628.m_backend.data._M_elems[4] = local_ac8.data._M_elems[4];
        local_628.m_backend.data._M_elems[5] = local_ac8.data._M_elems[5];
        local_628.m_backend.data._M_elems[0] = local_ac8.data._M_elems[0];
        local_628.m_backend.data._M_elems[1] = local_ac8.data._M_elems[1];
        local_628.m_backend.data._M_elems[2] = local_ac8.data._M_elems[2];
        local_628.m_backend.data._M_elems[3] = local_ac8.data._M_elems[3];
        local_628.m_backend.exp = local_ac8.exp;
        local_628.m_backend.neg = local_ac8.neg;
        local_628.m_backend.fpclass = local_ac8.fpclass;
        local_628.m_backend.prec_elem = local_ac8.prec_elem;
        local_668.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps3->m_backend).data._M_elems;
        local_668.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 2);
        local_668.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 4);
        local_668.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 6);
        local_668.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((eps3->m_backend).data._M_elems + 8);
        local_668.m_backend.exp = (eps3->m_backend).exp;
        local_668.m_backend.neg = (eps3->m_backend).neg;
        local_668.m_backend.fpclass = (eps3->m_backend).fpclass;
        local_668.m_backend.prec_elem = (eps3->m_backend).prec_elem;
        bVar7 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_628,&local_668);
        if (bVar7) {
          iVar4 = local_a28[local_a30];
          piVar11 = local_a40 + iVar4;
          pcVar9 = &local_a38[iVar4].m_backend;
          for (iVar12 = local_a28[local_a30 + 1]; iVar4 < iVar12; iVar12 = iVar12 + -1) {
            iVar5 = *piVar11;
            piVar11 = piVar11 + 1;
            local_328.fpclass = cpp_dec_float_finite;
            local_328.prec_elem = 10;
            local_328.data._M_elems[0] = 0;
            local_328.data._M_elems[1] = 0;
            local_328.data._M_elems[2] = 0;
            local_328.data._M_elems[3] = 0;
            local_328.data._M_elems[4] = 0;
            local_328.data._M_elems[5] = 0;
            local_328.data._M_elems._24_5_ = 0;
            local_328.data._M_elems[7]._1_3_ = 0;
            local_328.data._M_elems._32_5_ = 0;
            local_328._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_328,&local_ac8,pcVar9);
            updateSolutionVectorLright
                      (this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_328,iVar5,vec3 + iVar5,ridx3,rn3);
            pcVar9 = pcVar9 + 1;
          }
        }
      }
    }
    uVar8 = local_a30 + 1;
  }
  if ((this->l).updateType != 0) {
    local_a30 = (ulong)(this->l).firstUnused;
    uVar8 = local_a20;
    while ((long)uVar8 < (long)local_a30) {
      iVar4 = piVar11[uVar8];
      piVar10 = local_a40 + iVar4;
      pcVar9 = &local_a38[iVar4].m_backend;
      StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::StableSum((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)&local_990);
      StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::StableSum((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)&local_8a0);
      StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::StableSum((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)&local_8d8);
      uVar1 = uVar8 + 1;
      local_a20 = uVar8;
      for (iVar12 = piVar11[uVar8 + 1]; iVar4 < iVar12; iVar12 = iVar12 + -1) {
        local_9c8.fpclass = cpp_dec_float_finite;
        local_9c8.prec_elem = 10;
        local_9c8.data._M_elems[0] = 0;
        local_9c8.data._M_elems[1] = 0;
        local_9c8.data._M_elems[2] = 0;
        local_9c8.data._M_elems[3] = 0;
        local_9c8.data._M_elems[4] = 0;
        local_9c8.data._M_elems[5] = 0;
        local_9c8.data._M_elems._24_5_ = 0;
        local_9c8.data._M_elems[7]._1_3_ = 0;
        local_9c8.data._M_elems._32_5_ = 0;
        local_9c8._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_9c8,&vec[*piVar10].m_backend,pcVar9);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  (&local_990,&local_9c8);
        local_9c8.fpclass = cpp_dec_float_finite;
        local_9c8.prec_elem = 10;
        local_9c8.data._M_elems[0] = 0;
        local_9c8.data._M_elems[1] = 0;
        local_9c8.data._M_elems[2] = 0;
        local_9c8.data._M_elems[3] = 0;
        local_9c8.data._M_elems[4] = 0;
        local_9c8.data._M_elems[5] = 0;
        local_9c8.data._M_elems._24_5_ = 0;
        local_9c8.data._M_elems[7]._1_3_ = 0;
        local_9c8.data._M_elems._32_5_ = 0;
        local_9c8._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_9c8,&vec2[*piVar10].m_backend,pcVar9);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  (&local_8a0,&local_9c8);
        iVar5 = *piVar10;
        piVar10 = piVar10 + 1;
        local_9c8.fpclass = cpp_dec_float_finite;
        local_9c8.prec_elem = 10;
        local_9c8.data._M_elems[0] = 0;
        local_9c8.data._M_elems[1] = 0;
        local_9c8.data._M_elems[2] = 0;
        local_9c8.data._M_elems[3] = 0;
        local_9c8.data._M_elems[4] = 0;
        local_9c8.data._M_elems[5] = 0;
        local_9c8.data._M_elems._24_5_ = 0;
        local_9c8.data._M_elems[7]._1_3_ = 0;
        local_9c8.data._M_elems._32_5_ = 0;
        local_9c8._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_9c8,&vec3[iVar5].m_backend,pcVar9);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  (&local_8d8,&local_9c8);
        pcVar9 = pcVar9 + 1;
      }
      local_a18.data._M_elems._32_5_ = local_990.data._M_elems._32_5_;
      local_a18.data._M_elems[9]._1_3_ = local_990.data._M_elems[9]._1_3_;
      local_a18.data._M_elems[4] = local_990.data._M_elems[4];
      local_a18.data._M_elems[5] = local_990.data._M_elems[5];
      local_a18.data._M_elems._24_5_ = local_990.data._M_elems._24_5_;
      local_a18.data._M_elems[7]._1_3_ = local_990.data._M_elems[7]._1_3_;
      local_a18.data._M_elems[0] = local_990.data._M_elems[0];
      local_a18.data._M_elems[1] = local_990.data._M_elems[1];
      local_a18.data._M_elems[2] = local_990.data._M_elems[2];
      local_a18.data._M_elems[3] = local_990.data._M_elems[3];
      local_a18.exp = local_990.exp;
      local_a18.neg = local_990.neg;
      local_a18.prec_elem = local_990.prec_elem;
      local_a18.fpclass = local_990.fpclass;
      local_a78.data._M_elems[0] = local_8a0.data._M_elems[0];
      local_a78.data._M_elems[1] = local_8a0.data._M_elems[1];
      local_a78.data._M_elems[2] = local_8a0.data._M_elems[2];
      local_a78.data._M_elems[3] = local_8a0.data._M_elems[3];
      local_a78.data._M_elems[4] = local_8a0.data._M_elems[4];
      local_a78.data._M_elems[5] = local_8a0.data._M_elems[5];
      local_a78.data._M_elems._24_5_ = local_8a0.data._M_elems._24_5_;
      local_a78.data._M_elems[7]._1_3_ = local_8a0.data._M_elems[7]._1_3_;
      local_a78.data._M_elems._32_5_ = local_8a0.data._M_elems._32_5_;
      local_a78.data._M_elems[9]._1_3_ = local_8a0.data._M_elems[9]._1_3_;
      local_a78.exp = local_8a0.exp;
      local_a78.neg = local_8a0.neg;
      local_a78.fpclass = local_8a0.fpclass;
      local_a78.prec_elem = local_8a0.prec_elem;
      local_ac8.data._M_elems[0] = local_8d8.data._M_elems[0];
      local_ac8.data._M_elems[1] = local_8d8.data._M_elems[1];
      local_ac8.data._M_elems[2] = local_8d8.data._M_elems[2];
      local_ac8.data._M_elems[3] = local_8d8.data._M_elems[3];
      local_ac8.data._M_elems[4] = local_8d8.data._M_elems[4];
      local_ac8.data._M_elems[5] = local_8d8.data._M_elems[5];
      local_ac8.data._M_elems._24_5_ = local_8d8.data._M_elems._24_5_;
      local_ac8.data._M_elems[7]._1_3_ = local_8d8.data._M_elems[7]._1_3_;
      local_ac8.data._M_elems._32_5_ = local_8d8.data._M_elems._32_5_;
      local_ac8.data._M_elems[9]._1_3_ = local_8d8.data._M_elems[9]._1_3_;
      local_ac8.exp = local_8d8.exp;
      local_ac8.neg = local_8d8.neg;
      local_ac8.fpclass = local_8d8.fpclass;
      local_ac8.prec_elem = local_8d8.prec_elem;
      iVar4 = local_9d8[local_a20];
      local_958.m_backend.data._M_elems[8] = local_990.data._M_elems[8];
      local_958.m_backend.data._M_elems[9] = local_990.data._M_elems[9];
      local_958.m_backend.data._M_elems[4] = local_990.data._M_elems[4];
      local_958.m_backend.data._M_elems[5] = local_990.data._M_elems[5];
      local_958.m_backend.data._M_elems[6] = local_990.data._M_elems[6];
      local_958.m_backend.data._M_elems[7] = local_990.data._M_elems[7];
      local_958.m_backend.data._M_elems[0] = local_990.data._M_elems[0];
      local_958.m_backend.data._M_elems[1] = local_990.data._M_elems[1];
      local_958.m_backend.data._M_elems[2] = local_990.data._M_elems[2];
      local_958.m_backend.data._M_elems[3] = local_990.data._M_elems[3];
      local_958.m_backend.exp = local_990.exp;
      local_958.m_backend.neg = local_990.neg;
      local_958.m_backend.fpclass = local_990.fpclass;
      local_958.m_backend.prec_elem = local_990.prec_elem;
      local_6a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_9d0->m_backend).data._M_elems;
      local_6a8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((local_9d0->m_backend).data._M_elems + 2);
      local_6a8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((local_9d0->m_backend).data._M_elems + 4);
      local_6a8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((local_9d0->m_backend).data._M_elems + 6);
      local_6a8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((local_9d0->m_backend).data._M_elems + 8);
      local_6a8.m_backend.exp = (local_9d0->m_backend).exp;
      local_6a8.m_backend.neg = (local_9d0->m_backend).neg;
      local_6a8.m_backend.fpclass = (local_9d0->m_backend).fpclass;
      local_6a8.m_backend.prec_elem = (local_9d0->m_backend).prec_elem;
      bVar7 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_958,&local_6a8);
      if (bVar7) {
        local_6e8.m_backend.data._M_elems[9]._1_3_ = local_a18.data._M_elems[9]._1_3_;
        local_6e8.m_backend.data._M_elems._32_5_ = local_a18.data._M_elems._32_5_;
        local_6e8.m_backend.data._M_elems[7]._1_3_ = local_a18.data._M_elems[7]._1_3_;
        local_6e8.m_backend.data._M_elems._24_5_ = local_a18.data._M_elems._24_5_;
        local_6e8.m_backend.data._M_elems[4] = local_a18.data._M_elems[4];
        local_6e8.m_backend.data._M_elems[5] = local_a18.data._M_elems[5];
        local_6e8.m_backend.data._M_elems[0] = local_a18.data._M_elems[0];
        local_6e8.m_backend.data._M_elems[1] = local_a18.data._M_elems[1];
        local_6e8.m_backend.data._M_elems[2] = local_a18.data._M_elems[2];
        local_6e8.m_backend.data._M_elems[3] = local_a18.data._M_elems[3];
        local_6e8.m_backend.exp = local_a18.exp;
        local_6e8.m_backend.neg = local_a18.neg;
        local_6e8.m_backend.fpclass = local_a18.fpclass;
        local_6e8.m_backend.prec_elem = local_a18.prec_elem;
        updateSolutionVectorLright(this,&local_6e8,iVar4,vec + iVar4,local_a88,local_a80);
      }
      local_728.m_backend.data._M_elems[9]._1_3_ = local_a78.data._M_elems[9]._1_3_;
      local_728.m_backend.data._M_elems._32_5_ = local_a78.data._M_elems._32_5_;
      local_728.m_backend.data._M_elems[7]._1_3_ = local_a78.data._M_elems[7]._1_3_;
      local_728.m_backend.data._M_elems._24_5_ = local_a78.data._M_elems._24_5_;
      local_728.m_backend.data._M_elems[4] = local_a78.data._M_elems[4];
      local_728.m_backend.data._M_elems[5] = local_a78.data._M_elems[5];
      local_728.m_backend.data._M_elems[0] = local_a78.data._M_elems[0];
      local_728.m_backend.data._M_elems[1] = local_a78.data._M_elems[1];
      local_728.m_backend.data._M_elems[2] = local_a78.data._M_elems[2];
      local_728.m_backend.data._M_elems[3] = local_a78.data._M_elems[3];
      local_728.m_backend.exp = local_a78.exp;
      local_728.m_backend.neg = local_a78.neg;
      local_728.m_backend.fpclass = local_a78.fpclass;
      local_728.m_backend.prec_elem = local_a78.prec_elem;
      local_768.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
      local_768.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2)
      ;
      local_768.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
      local_768.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
      local_768.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
      local_768.m_backend.exp = (eps2->m_backend).exp;
      local_768.m_backend.neg = (eps2->m_backend).neg;
      local_768.m_backend.fpclass = (eps2->m_backend).fpclass;
      local_768.m_backend.prec_elem = (eps2->m_backend).prec_elem;
      bVar7 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_728,&local_768);
      piVar11 = local_a28;
      if (bVar7) {
        local_7a8.m_backend.data._M_elems[9]._1_3_ = local_a78.data._M_elems[9]._1_3_;
        local_7a8.m_backend.data._M_elems._32_5_ = local_a78.data._M_elems._32_5_;
        local_7a8.m_backend.data._M_elems[7]._1_3_ = local_a78.data._M_elems[7]._1_3_;
        local_7a8.m_backend.data._M_elems._24_5_ = local_a78.data._M_elems._24_5_;
        local_7a8.m_backend.data._M_elems[4] = local_a78.data._M_elems[4];
        local_7a8.m_backend.data._M_elems[5] = local_a78.data._M_elems[5];
        local_7a8.m_backend.data._M_elems[0] = local_a78.data._M_elems[0];
        local_7a8.m_backend.data._M_elems[1] = local_a78.data._M_elems[1];
        local_7a8.m_backend.data._M_elems[2] = local_a78.data._M_elems[2];
        local_7a8.m_backend.data._M_elems[3] = local_a78.data._M_elems[3];
        local_7a8.m_backend.exp = local_a78.exp;
        local_7a8.m_backend.neg = local_a78.neg;
        local_7a8.m_backend.fpclass = local_a78.fpclass;
        local_7a8.m_backend.prec_elem = local_a78.prec_elem;
        updateSolutionVectorLright(this,&local_7a8,iVar4,vec2 + iVar4,ridx2,rn2);
      }
      local_7e8.m_backend.data._M_elems[9]._1_3_ = local_ac8.data._M_elems[9]._1_3_;
      local_7e8.m_backend.data._M_elems._32_5_ = local_ac8.data._M_elems._32_5_;
      local_7e8.m_backend.data._M_elems[7]._1_3_ = local_ac8.data._M_elems[7]._1_3_;
      local_7e8.m_backend.data._M_elems._24_5_ = local_ac8.data._M_elems._24_5_;
      local_7e8.m_backend.data._M_elems[4] = local_ac8.data._M_elems[4];
      local_7e8.m_backend.data._M_elems[5] = local_ac8.data._M_elems[5];
      local_7e8.m_backend.data._M_elems[0] = local_ac8.data._M_elems[0];
      local_7e8.m_backend.data._M_elems[1] = local_ac8.data._M_elems[1];
      local_7e8.m_backend.data._M_elems[2] = local_ac8.data._M_elems[2];
      local_7e8.m_backend.data._M_elems[3] = local_ac8.data._M_elems[3];
      local_7e8.m_backend.exp = local_ac8.exp;
      local_7e8.m_backend.neg = local_ac8.neg;
      local_7e8.m_backend.fpclass = local_ac8.fpclass;
      local_7e8.m_backend.prec_elem = local_ac8.prec_elem;
      local_828.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps3->m_backend).data._M_elems;
      local_828.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 2)
      ;
      local_828.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((eps3->m_backend).data._M_elems + 4);
      local_828.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((eps3->m_backend).data._M_elems + 6);
      local_828.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((eps3->m_backend).data._M_elems + 8);
      local_828.m_backend.exp = (eps3->m_backend).exp;
      local_828.m_backend.neg = (eps3->m_backend).neg;
      local_828.m_backend.fpclass = (eps3->m_backend).fpclass;
      local_828.m_backend.prec_elem = (eps3->m_backend).prec_elem;
      bVar7 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_7e8,&local_828);
      uVar8 = uVar1;
      if (bVar7) {
        local_868.m_backend.data._M_elems[9]._1_3_ = local_ac8.data._M_elems[9]._1_3_;
        local_868.m_backend.data._M_elems._32_5_ = local_ac8.data._M_elems._32_5_;
        local_868.m_backend.data._M_elems[7]._1_3_ = local_ac8.data._M_elems[7]._1_3_;
        local_868.m_backend.data._M_elems._24_5_ = local_ac8.data._M_elems._24_5_;
        local_868.m_backend.data._M_elems[4] = local_ac8.data._M_elems[4];
        local_868.m_backend.data._M_elems[5] = local_ac8.data._M_elems[5];
        local_868.m_backend.data._M_elems[0] = local_ac8.data._M_elems[0];
        local_868.m_backend.data._M_elems[1] = local_ac8.data._M_elems[1];
        local_868.m_backend.data._M_elems[2] = local_ac8.data._M_elems[2];
        local_868.m_backend.data._M_elems[3] = local_ac8.data._M_elems[3];
        local_868.m_backend.exp = local_ac8.exp;
        local_868.m_backend.neg = local_ac8.neg;
        local_868.m_backend.fpclass = local_ac8.fpclass;
        local_868.m_backend.prec_elem = local_ac8.prec_elem;
        updateSolutionVectorLright(this,&local_868,iVar4,vec3 + iVar4,ridx3,rn3);
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveLright3(
   R* vec, int* ridx, int& rn, R eps,
   R* vec2, int* ridx2, int& rn2, R eps2,
   R* vec3, int* ridx3, int& rn3, R eps3)
{
   int i, j, k, n;
   int end;
   R x, x2, x3;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   for(i = 0; i < end; ++i)
   {
      j = lrow[i];
      x = vec[j];
      x2 = vec2[j];
      x3 = vec3[j];

      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         if(isNotZero(x2, eps2))
         {
            if(isNotZero(x3, eps3))
            {
               // case 1: all three vectors are nonzero at j
               for(j = lbeg[i + 1]; j > k; --j)
               {
                  assert(*idx >= 0 && *idx < thedim);
                  n = *idx++;
                  updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
                  updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
                  updateSolutionVectorLright(x3 * (*val), n, vec3[n], ridx3, rn3);
                  ++val;
               }
            }
            else
            {
               // case 2: 1 and 2 are nonzero at j
               for(j = lbeg[i + 1]; j > k; --j)
               {
                  assert(*idx >= 0 && *idx < thedim);
                  n = *idx++;
                  updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
                  updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
                  ++val;
               }
            }
         }
         else if(isNotZero(x3, eps3))
         {
            // case 3: 1 and 3 are nonzero at j
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
               updateSolutionVectorLright(x3 * (*val), n, vec3[n], ridx3, rn3);
               ++val;
            }
         }
         else
         {
            // case 4: only 1 is nonzero at j
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
               ++val;
            }
         }
      }
      else if(isNotZero(x2, eps2))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         if(isNotZero(x3, eps3))
         {
            // case 5: 2 and 3 are nonzero at j
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
               updateSolutionVectorLright(x3 * (*val), n, vec3[n], ridx3, rn3);
               ++val;
            }
         }
         else
         {
            // case 6: only 2 is nonzero at j
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
               ++val;
            }
         }
      }
      else if(isNotZero(x3, eps3))
      {
         // case 7: only 3 is nonzero at j
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            n = *idx++;
            updateSolutionVectorLright(x3 * (*val), n, vec3[n], ridx3, rn3);
            ++val;
         }
      }
   }

   if(l.updateType)                      /* Forest-Tomlin Updates */
   {
      end = l.firstUnused;

      for(; i < end; ++i)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         StableSum<R> tmp1, tmp2, tmp3;

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            tmp1 += vec[*idx] * (*val);
            tmp2 += vec2[*idx] * (*val);
            tmp3 += vec3[*idx++] * (*val++);
         }

         x = R(tmp1);
         x2 = R(tmp2);
         x3 = R(tmp3);

         j = lrow[i];

         if(isNotZero(x, eps))
            updateSolutionVectorLright(x, j, vec[j], ridx, rn);

         if(isNotZero(x2, eps2))
            updateSolutionVectorLright(x2, j, vec2[j], ridx2, rn2);

         if(isNotZero(x3, eps3))
            updateSolutionVectorLright(x3, j, vec3[j], ridx3, rn3);
      }
   }
}